

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

uint64_t __thiscall mkvmuxer::Cues::Size(Cues *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  uint64 value;
  int32_t i;
  long lVar3;
  
  value = 0;
  for (lVar3 = 0; lVar3 < this->cue_entries_size_; lVar3 = lVar3 + 1) {
    uVar1 = CuePoint::Size(this->cue_entries_[lVar3]);
    value = value + uVar1;
  }
  uVar2 = EbmlMasterElementSize(0x1c53bb6b,value);
  return uVar2 + value;
}

Assistant:

uint64_t Cues::Size() {
  uint64_t size = 0;
  for (int32_t i = 0; i < cue_entries_size_; ++i)
    size += GetCueByIndex(i)->Size();
  size += EbmlMasterElementSize(libwebm::kMkvCues, size);
  return size;
}